

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::isDirective(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  bool local_181;
  string local_160;
  byte local_139;
  string local_138;
  byte local_111;
  string local_110;
  byte local_e9;
  string local_e8;
  byte local_c1;
  string local_c0;
  byte local_99;
  string local_98;
  byte local_71;
  string local_70;
  string local_40;
  string *local_20;
  string *line_local;
  Assembler *this_local;
  
  local_20 = line;
  line_local = &this->inputFileName;
  std::__cxx11::string::string((string *)&local_40,(string *)line);
  local_71 = 0;
  local_99 = 0;
  local_c1 = 0;
  local_e9 = 0;
  local_111 = 0;
  local_139 = 0;
  bVar1 = false;
  bVar2 = checkIfSection(this,&local_40);
  local_181 = true;
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_70,(string *)line);
    local_71 = 1;
    bVar2 = checkIfEnd(this,&local_70);
    local_181 = true;
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_98,(string *)line);
      local_99 = 1;
      bVar2 = checkIfEqu(this,&local_98);
      local_181 = true;
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_c0,(string *)line);
        local_c1 = 1;
        bVar2 = checkIfExtern(this,&local_c0);
        local_181 = true;
        if (!bVar2) {
          std::__cxx11::string::string((string *)&local_e8,(string *)line);
          local_e9 = 1;
          bVar2 = checkIfGlobal(this,&local_e8);
          local_181 = true;
          if (!bVar2) {
            std::__cxx11::string::string((string *)&local_110,(string *)line);
            local_111 = 1;
            bVar2 = checkIfSkip(this,&local_110);
            local_181 = true;
            if (!bVar2) {
              std::__cxx11::string::string((string *)&local_138,(string *)line);
              local_139 = 1;
              bVar2 = checkIfWord(this,&local_138);
              local_181 = true;
              if (!bVar2) {
                std::__cxx11::string::string((string *)&local_160,(string *)line);
                bVar1 = true;
                local_181 = checkIfLabel(this,&local_160);
              }
            }
          }
        }
      }
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_160);
  }
  if ((local_139 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_138);
  }
  if ((local_111 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((local_e9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_c1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_71 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return local_181 != false;
}

Assistant:

bool Assembler::isDirective(string line) {
    if (checkIfSection(line) || checkIfEnd(line) || checkIfEqu(line) || checkIfExtern(line)
        || checkIfGlobal(line) || checkIfSkip(line) || checkIfWord(line)
        || checkIfLabel(line))
        return true;
    else return false;
}